

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AirPlatformAppearance.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::AirPlatformAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,AirPlatformAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KINT32 Value_02;
  KINT32 Value_03;
  KINT32 Value_04;
  KINT32 Value_05;
  KINT32 Value_06;
  KStringStream ss;
  KString local_2a0;
  KString local_280;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Air Platform Appearance:",0x18);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tPaint Scheme:           ",0x1a);
  ENUMS::GetEnumAsStringPaintScheme_abi_cxx11_(&local_1c0,(ENUMS *)(ulong)((uint)*this & 1),Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tMobility Kill:          ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tNVG Mode:               ",0x1a);
  ENUMS::GetEnumAsStringNVGMode_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)((uint)*this >> 2 & 1),Value_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tDamage:                 ",0x1a);
  ENUMS::GetEnumAsStringEntityDamage_abi_cxx11_
            (&local_200,(ENUMS *)(ulong)((uint)*this >> 3 & 3),Value_01);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tSmoke:                  ",0x1a);
  ENUMS::GetEnumAsStringEntitySmoke_abi_cxx11_
            (&local_220,(ENUMS *)(ulong)((uint)*this >> 5 & 3),Value_02);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tTrailing Effect:        ",0x1a);
  ENUMS::GetEnumAsStringEntityTrailingEffect_abi_cxx11_
            (&local_240,(ENUMS *)(ulong)((uint)*this >> 7 & 3),Value_03);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_240._M_dataplus._M_p,local_240._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tCanopy State:           ",0x1a);
  ENUMS::GetEnumAsStringEntityHatchState_abi_cxx11_
            (&local_260,(ENUMS *)(ulong)((uint)*this >> 9 & 7),Value_04);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_260._M_dataplus._M_p,local_260._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tLanding Lights:         ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tNavigation Lights:      ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tAnti-Collision Lights:  ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tFlaming Effect:         ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tAfterburner:            ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tLower Anti-Collision Light: ",0x1e)
  ;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tUpper Anti-Collision Light: ",0x1e)
  ;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tAnti-Collision Light:   ",0x1a);
  ENUMS::GetEnumAsStringAntiCollisionDayNight_abi_cxx11_
            (&local_280,(ENUMS *)(ulong)((uint)*this >> 0x13 & 1),Value_05);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_280._M_dataplus._M_p,local_280._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tIs Blinking:            ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tFrozen Status:          ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tPower Plant:            ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tState:                  ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tFormation Lights:       ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tLanding Gear Extended:  ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tCargo Doors Opened:     ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\n\tNavigation/Position Brightness: ",0x22);
  ENUMS::GetEnumAsStringNavigationPositionBrightness_abi_cxx11_
            (&local_2a0,(ENUMS *)(ulong)((uint)*this >> 0x1b & 1),Value_06);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tSpot Lights:            ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tInterior Lights:        ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tReverse Thrust Engaged: ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tWeight-on-Wheels:       ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString AirPlatformAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "Air Platform Appearance:"
       << "\n\tPaint Scheme:           " << GetEnumAsStringPaintScheme( m_PaintScheme )
       << "\n\tMobility Kill:          " << m_MobilityKill
       << "\n\tNVG Mode:               " << GetEnumAsStringNVGMode( m_NVGMode )
       << "\n\tDamage:                 " << GetEnumAsStringEntityDamage( m_Damage )
       << "\n\tSmoke:                  " << GetEnumAsStringEntitySmoke( m_Smoke )
       << "\n\tTrailing Effect:        " << GetEnumAsStringEntityTrailingEffect( m_TrailingEffect )
       << "\n\tCanopy State:           " << GetEnumAsStringEntityHatchState( m_CanopyState )
       << "\n\tLanding Lights:         " << m_LandingLights
       << "\n\tNavigation Lights:      " << m_NavLights
       << "\n\tAnti-Collision Lights:  " << m_AntiColLights
       << "\n\tFlaming Effect:         " << m_FlamingEffectField		
       << "\n\tAfterburner:            " << m_Afterburner
       << "\n\tLower Anti-Collision Light: " << m_LowerAntiCollisionLight
       << "\n\tUpper Anti-Collision Light: " << m_UpperAntiCollisionLight
       << "\n\tAnti-Collision Light:   " << GetEnumAsStringAntiCollisionDayNight( m_AntiCollisionLightDayNight )
       << "\n\tIs Blinking:            " << m_IsBlinking
       << "\n\tFrozen Status:          " << m_FrozenStatus
       << "\n\tPower Plant:            " << m_PowerPlantStatus
       << "\n\tState:                  " << m_State
       << "\n\tFormation Lights:       " << m_FormationLights
       << "\n\tLanding Gear Extended:  " << m_LandingGearExtended
       << "\n\tCargo Doors Opened:     " << m_CargoDoorsOpened
       << "\n\tNavigation/Position Brightness: " << GetEnumAsStringNavigationPositionBrightness( m_NavigationPositionBrightness )
       << "\n\tSpot Lights:            " << m_SpotLights
       << "\n\tInterior Lights:        " << m_InteriorLights
       << "\n\tReverse Thrust Engaged: " << m_ReverseThrustEngaged
       << "\n\tWeight-on-Wheels:       " << m_WeightOnWheels
       << "\n";

    return ss.str();
}